

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateManager.cpp
# Opt level: O3

uint64_t __thiscall
helics::MessageFederateManager::pendingMessageCount(MessageFederateManager *this)

{
  bool bVar1;
  _Elt_pointer pEVar2;
  size_t sVar3;
  pthread_rwlock_t *__rwlock;
  _Elt_pointer pEVar4;
  _Map_pointer ppEVar5;
  uint uVar6;
  uint64_t uVar7;
  _Elt_pointer this_00;
  
  bVar1 = (this->eptData).enabled;
  if (bVar1 == true) {
    __rwlock = (pthread_rwlock_t *)&(this->eptData).m_mutex;
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)&__rwlock->__data);
  }
  else {
    __rwlock = (pthread_rwlock_t *)0x0;
  }
  this_00 = (this->eptData).m_obj.
            super__Deque_base<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
  pEVar2 = (this->eptData).m_obj.
           super__Deque_base<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  uVar7 = 0;
  if (this_00 != pEVar2) {
    pEVar4 = (this->eptData).m_obj.
             super__Deque_base<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last;
    ppEVar5 = (this->eptData).m_obj.
              super__Deque_base<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      sVar3 = gmlc::containers::
              SimpleQueue<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::mutex>
              ::size(&this_00->messages);
      this_00 = this_00 + 1;
      if (this_00 == pEVar4) {
        this_00 = ppEVar5[1];
        ppEVar5 = ppEVar5 + 1;
        pEVar4 = this_00 + 3;
      }
      uVar6 = (int)uVar7 + (int)sVar3;
      uVar7 = (uint64_t)uVar6;
    } while (this_00 != pEVar2);
    uVar7 = (uint64_t)(int)uVar6;
  }
  if (bVar1 != false) {
    pthread_rwlock_unlock(__rwlock);
  }
  return uVar7;
}

Assistant:

uint64_t MessageFederateManager::pendingMessageCount() const
{
    auto eptDat = eptData.lock_shared();
    return std::accumulate(eptDat.begin(), eptDat.end(), 0, [](uint64_t count, const auto& ept) {
        return count + static_cast<uint64_t>(ept.messages.size());
    });
    /*
    uint64_t size{ 0 };
    for (const auto& mq : eptDat) {
        size = size + mq.messages.size();
    }
    return size;
    */
}